

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__k;
  cmCTest *pcVar1;
  pointer pbVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  pointer pbVar9;
  char **ppcVar10;
  string_view str;
  string_view prefix;
  string filename;
  int local_410;
  undefined4 uStack_40c;
  string finalpath;
  string FoundSource;
  string line;
  ifstream fin;
  byte abStack_218 [488];
  
  FoundSource._M_dataplus._M_p = (pointer)&FoundSource.field_2;
  FoundSource._M_string_length = 0;
  FoundSource.field_2._M_local_buf[0] = '\0';
  finalpath._M_dataplus._M_p = (pointer)&finalpath.field_2;
  finalpath._M_string_length = 0;
  finalpath.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(name,"source");
  if (bVar3) {
    this->InSource = true;
    goto LAB_001bae94;
  }
  bVar3 = std::operator==(name,"sources");
  if (bVar3) {
    this->InSources = true;
    goto LAB_001bae94;
  }
  bVar3 = std::operator==(name,"class");
  if (!bVar3) {
    bVar3 = std::operator==(name,"line");
    if ((bVar3) && (this->SkipThisClass == false)) {
      ppcVar10 = atts + 1;
      uVar6 = 0xffffffff;
      iVar4 = -1;
      do {
        __s1 = ppcVar10[-1];
        iVar5 = strcmp(__s1,"hits");
        if (iVar5 == 0) {
          iVar4 = atoi(*ppcVar10);
        }
        else {
          iVar5 = strcmp(__s1,"number");
          if (iVar5 == 0) {
            uVar6 = atoi(*ppcVar10);
          }
        }
        ppcVar10 = ppcVar10 + 1;
      } while ((int)uVar6 < 1 || iVar4 < 0);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
      (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar6 - 1] = iVar4;
    }
    goto LAB_001bae94;
  }
  do {
    iVar4 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar4 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
  poVar7 = std::operator<<((ostream *)&fin,"Reading file: ");
  poVar7 = std::operator<<(poVar7,*atts);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x3f,line._M_dataplus._M_p,this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,*atts,(allocator<char> *)&fin);
  __k = &this->CurFileName;
  (this->CurFileName)._M_string_length = 0;
  *(this->CurFileName)._M_dataplus._M_p = '\0';
  pbVar9 = (this->FilePaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->FilePaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar9 == pbVar2) goto LAB_001babc3;
    str._M_str = filename._M_dataplus._M_p;
    str._M_len = filename._M_string_length;
    prefix._M_str = (pbVar9->_M_dataplus)._M_p;
    prefix._M_len = pbVar9->_M_string_length;
    bVar3 = cmHasPrefix(str,prefix);
    pbVar9 = pbVar9 + 1;
  } while (!bVar3);
  std::__cxx11::string::_M_assign((string *)__k);
LAB_001babc3:
  if ((this->CurFileName)._M_string_length == 0) {
    pbVar9 = (this->FilePaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->FilePaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar9 == pbVar2) goto LAB_001bac2c;
      cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
                ((string *)&fin,pbVar9,(char (*) [2])0x7d6251,&filename);
      std::__cxx11::string::operator=((string *)&finalpath,(string *)&fin);
      std::__cxx11::string::~string((string *)&fin);
      bVar3 = cmsys::SystemTools::FileExists(&finalpath);
      pbVar9 = pbVar9 + 1;
    } while (!bVar3);
    std::__cxx11::string::_M_assign((string *)__k);
  }
LAB_001bac2c:
  std::ifstream::ifstream(&fin,(__k->_M_dataplus)._M_p,_S_in);
  if (((this->CurFileName)._M_string_length == 0) ||
     ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0)) {
    cmStrCat<std::__cxx11::string&,char_const(&)[2],char_const*&>
              (&line,&this->Coverage->BinaryDir,(char (*) [2])0x7d6251,atts);
    std::__cxx11::string::operator=((string *)__k,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::open((char *)&fin,(_Ios_Openmode)(__k->_M_dataplus)._M_p);
    if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) goto LAB_001bae09;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
    poVar7 = std::operator<<((ostream *)&line,"Skipping system file ");
    poVar7 = std::operator<<(poVar7,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x61,(char *)CONCAT44(uStack_40c,local_410),this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
    this->SkipThisClass = true;
  }
  else {
LAB_001bae09:
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,__k);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff), bVar3) {
      local_410 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar8,&local_410);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&filename);
LAB_001bae94:
  std::__cxx11::string::~string((string *)&finalpath);
  std::__cxx11::string::~string((string *)&FoundSource);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName.clear();

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (std::string const& filePath : this->FilePaths) {
            if (cmHasPrefix(filename, filePath)) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName.empty()) {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (std::string const& filePath : this->FilePaths) {
              finalpath = cmStrCat(filePath, "/", filename);
              if (cmSystemTools::FileExists(finalpath)) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName.empty() || !fin) {
            this->CurFileName =
              cmStrCat(this->Coverage.BinaryDir, "/", atts[tagCount + 1]);
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }